

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngineTest.cpp
# Opt level: O0

void __thiscall
(anonymous_namespace)::BuildEngineTest_discoveredDependencies_Test::TestBody()::
TaskWithDiscoveredDependency::start(llbuild::core::TaskInterface_(void *this,TaskInterface ti)

{
  KeyType local_40;
  void *local_20;
  TaskWithDiscoveredDependency *this_local;
  TaskInterface ti_local;
  
  ti_local.impl = ti.ctx;
  this_local = (TaskWithDiscoveredDependency *)ti.impl;
  local_20 = this;
  llbuild::core::KeyType::KeyType(&local_40,"value-A");
  llbuild::core::TaskInterface::request((TaskInterface *)&this_local,&local_40,0);
  llbuild::core::KeyType::~KeyType(&local_40);
  return;
}

Assistant:

virtual void start(TaskInterface ti) override {
      // Request the known input.
      ti.request("value-A", 0);
    }